

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

void cmime_message_set_message_id(CMimeMessage_T *message,char *mid)

{
  size_t sVar1;
  int local_28;
  int local_24;
  int pos;
  int i;
  char *id;
  char *mid_local;
  CMimeMessage_T *message_local;
  
  if (*mid == '<') {
    _pos = strdup(mid);
  }
  else {
    sVar1 = strlen(mid);
    _pos = (char *)malloc(sVar1 + 4);
    *_pos = '<';
    local_24 = 0;
    local_28 = 1;
    while( true ) {
      sVar1 = strlen(mid);
      if (sVar1 <= (ulong)(long)local_24) break;
      _pos[local_28] = mid[local_24];
      local_24 = local_24 + 1;
      local_28 = local_28 + 1;
    }
    _pos[local_28] = '>';
    _pos[local_28 + 1] = '\0';
  }
  _cmime_internal_set_linked_header_value(message->headers,"Message-ID",_pos);
  free(_pos);
  return;
}

Assistant:

void cmime_message_set_message_id(CMimeMessage_T *message, const char *mid) {
    char *id = NULL;
    int i;
    int pos = 0;
    if (mid[0] != '<') {
        id = (char *)malloc(strlen(mid) + 4);
        id[pos++] = '<';
        for (i = 0; i < strlen(mid); i++) {
            id[pos++] = mid[i];
        }
        id[pos++] = '>';
        id[pos++] = '\0';
    } else
        id = strdup(mid);

    _cmime_internal_set_linked_header_value(message->headers,"Message-ID",id);
    free(id);
}